

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

TX_SIZE av1_get_tx_size(int plane,MACROBLOCKD *xd)

{
  byte bVar1;
  byte *pbVar2;
  TX_SIZE TVar3;
  undefined4 in_register_0000003c;
  
  pbVar2 = (byte *)**(undefined8 **)(CONCAT44(in_register_0000003c,plane) + 0x1eb8);
  if (*(int *)(CONCAT44(in_register_0000003c,plane) + 0x29c4 +
              (ulong)(*(ushort *)(pbVar2 + 0xa7) & 7) * 4) == 0) {
    bVar1 = ""[av1_ss_size_lookup[*pbVar2][*(int *)(CONCAT44(in_register_0000003c,plane) + 0xa44)]
               [*(int *)(CONCAT44(in_register_0000003c,plane) + 0xa48)]];
    TVar3 = '\x03';
    if ((1 < bVar1 - 0xb) && (bVar1 != 4)) {
      if (bVar1 == 0x11) {
        return '\t';
      }
      if (bVar1 == 0x12) {
        return '\n';
      }
      return bVar1;
    }
  }
  else {
    TVar3 = '\0';
  }
  return TVar3;
}

Assistant:

static inline TX_SIZE av1_get_tx_size(int plane, const MACROBLOCKD *xd) {
  const MB_MODE_INFO *mbmi = xd->mi[0];
  if (xd->lossless[mbmi->segment_id]) return TX_4X4;
  if (plane == 0) return mbmi->tx_size;
  const MACROBLOCKD_PLANE *pd = &xd->plane[plane];
  return av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                               pd->subsampling_y);
}